

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
Net::propagate_back(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Net *this,
                   int cur_layer,vector<double,_std::allocator<double>_> *y,
                   vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   *derivative,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *bias_derivative)

{
  double *pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  void *pvVar4;
  long lVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *pvVar8;
  pointer pvVar9;
  long lVar10;
  long lVar11;
  vector<double,_std::allocator<double>_> *pvVar12;
  ulong uVar13;
  ulong uVar14;
  Layer lol;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> *local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  long local_90;
  vector<double,_std::allocator<double>_> local_88;
  long local_68;
  Net *local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_58;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_50;
  long local_48;
  ulong local_40;
  double local_38;
  
  lVar11 = (long)cur_layer;
  pvVar9 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98 = y;
  local_58 = bias_derivative;
  local_50 = derivative;
  if (((long)(this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) * -0x5555555555555555 +
      -1 != lVar11) {
    add_matrix<double>(&local_b8,y,pvVar9 + lVar11);
    pdVar2 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar2 != (pointer)0x0) {
      operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    pvVar9 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pvVar12 = local_98;
  lVar10 = (long)(cur_layer + -1);
  local_90 = lVar10 * 3;
  local_a0 = __return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)*(pointer *)
                    ((long)&pvVar9[lVar10].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8) -
             *(long *)&pvVar9[lVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data >> 3,(allocator_type *)&local_b8);
  pvVar9 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar9[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 8) !=
      pvVar9[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar14 = 0;
    local_68 = lVar11 * 3;
    local_60 = this;
    do {
      lVar10 = local_90 * 8;
      dVar6 = derivative_function(this,*(double *)
                                        (*(long *)&(this->meshZ).
                                                                                                      
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + uVar14 * 8));
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((*(double *)
                             (*(long *)&(this->mesh).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + uVar14 * 8) -
                           (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar14]) * (dVar6 + dVar6));
      mult_matrix_on_constant<double>
                (&local_b8,
                 (vector<double,_std::allocator<double>_> *)
                 ((long)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar10),(double *)&local_88);
      pvVar8 = local_50;
      lVar10 = local_68;
      add_matrix<double>(&local_88,
                         (vector<double,_std::allocator<double>_> *)
                         (uVar14 * 0x18 +
                         *(long *)((long)&(((local_50->
                                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          )._M_impl.super__Vector_impl_data + local_68 * 8)),
                         &local_b8);
      this = local_60;
      lVar10 = *(long *)((long)&(((pvVar8->
                                  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data + lVar10 * 8);
      pvVar4 = *(void **)(lVar10 + uVar14 * 0x18);
      lVar5 = *(long *)(lVar10 + 0x10 + uVar14 * 0x18);
      pdVar1 = (double *)(lVar10 + uVar14 * 0x18);
      *pdVar1 = (double)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
      pdVar1[1] = (double)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish;
      *(pointer *)(lVar10 + 0x10 + uVar14 * 0x18) =
           local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_48 = uVar14 * 3;
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,lVar5 - (long)pvVar4);
        if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
      }
      dVar6 = derivative_function(this,*(double *)
                                        (*(long *)&(this->meshZ).
                                                                                                      
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + uVar14 * 8));
      lVar5 = local_48;
      pvVar7 = local_98;
      pvVar12 = local_a0;
      pvVar9 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = *(long *)&(local_58->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar11].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data;
      *(double *)(lVar10 + uVar14 * 8) =
           (*(double *)
             (*(long *)&pvVar9[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + uVar14 * 8) -
           (local_98->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar14]) * (dVar6 + dVar6) +
           *(double *)(lVar10 + uVar14 * 8);
      if (*(long *)((long)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + local_90 * 8 + 8) !=
          *(long *)((long)&(pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + local_90 * 8)) {
        uVar13 = 0;
        local_40 = uVar14;
        do {
          local_38 = *(double *)
                      (*(long *)(*(long *)&(this->weights).
                                           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data + lVar5 * 8) +
                      uVar13 * 8);
          dVar6 = derivative_function(this,*(double *)
                                            (*(long *)&(this->meshZ).
                                                                                                              
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + local_40 * 8));
          pvVar9 = (this->mesh).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar2 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2[local_40] =
               (*(double *)
                 (*(long *)&pvVar9[lVar11].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + local_40 * 8) -
               (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[local_40]) * (local_38 + local_38) * dVar6 +
               pdVar2[local_40];
          uVar13 = uVar13 + 1;
          uVar14 = local_40;
        } while (uVar13 < (ulong)(*(long *)((long)&(pvVar9->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data +
                                           local_90 * 8 + 8) -
                                  *(long *)((long)&(pvVar9->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + local_90 * 8)
                                 >> 3));
      }
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        pvVar9 = (this->mesh).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar14 = uVar14 + 1;
      pvVar12 = local_98;
    } while (uVar14 < (ulong)(*(long *)((long)&(pvVar9->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + local_68 * 8 + 8) -
                              *(long *)((long)&(pvVar9->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + local_68 * 8) >> 3)
            );
  }
  pvVar12 = local_a0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbff0000000000000;
  mult_matrix_on_constant<double>(&local_b8,local_a0,(double *)&local_88);
  pdVar2 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
    if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return pvVar12;
}

Assistant:

std::vector<double> Net::propagate_back(int cur_layer, std::vector<double> y, std::vector<std::vector<Layer> >& derivative, std::vector<Layer>& bias_derivative){
    if (cur_layer != mesh.size()-1) y = add_matrix(y, mesh[cur_layer]);
    std::vector<double> y_prev(mesh[cur_layer-1].size());
    for (int i = 0; i < mesh[cur_layer].size(); ++i) {
        Layer lol = mult_matrix_on_constant(mesh[cur_layer-1], (2 * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i])));
        derivative[cur_layer][i] = add_matrix(derivative[cur_layer][i], lol);
        bias_derivative[cur_layer][i] += (2 * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i]));
        for (int j = 0; j < mesh[cur_layer-1].size(); ++j)
            y_prev[i] += (2 * weights[cur_layer][i][j] * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i]));

//        threshold(derivative[cur_layer][i], MOD); derivative_function
    }
//    threshold(y_prev, 1.0);
//    threshold(bias_derivative[cur_layer], MOD);
    y_prev = mult_matrix_on_constant(y_prev, -1.0);
    return y_prev;
}